

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_drop_col(jx9_context *pCtx,int argc,jx9_value **argv)

{
  unqlite_vm *puVar1;
  _func_void_unqlite_kv_cursor_ptr *p_Var2;
  jx9_user_func *pjVar3;
  _func_int_unqlite_kv_cursor_ptr *p_Var4;
  unqlite_vm *puVar5;
  unqlite_col_record *puVar6;
  unqlite *pBackend;
  unqlite_kv_cursor *pChunk;
  unqlite_col *puVar7;
  int iVar8;
  char *pcVar9;
  unqlite_col *pCol;
  anon_union_8_3_18420de5_for_x aVar10;
  int iFlag;
  jx9_value *pObj;
  uint uVar11;
  jx9_vm *pVm;
  unqlite_col_record *pChunk_00;
  long nId;
  bool bVar12;
  int nByte;
  SyString sName;
  uint local_44;
  SyString local_40;
  
  if (argc < 1) {
    pjVar3 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar9 = "Missing collection name";
LAB_0011902b:
    jx9VmThrowError(pVm,&pjVar3->sName,1,pcVar9);
  }
  else {
    pcVar9 = jx9_value_to_string(*argv,(int *)&local_44);
    if ((int)local_44 < 1) {
      pjVar3 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar9 = "Invalid collection name";
      goto LAB_0011902b;
    }
    local_40.nByte = local_44;
    local_40.zString = pcVar9;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_40,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      puVar1 = pCol->pVm;
      p_Var2 = pCol->pCursor->pStore->pIo->pMethods->xReset;
      if (p_Var2 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
        (*p_Var2)(pCol->pCursor);
      }
      iVar8 = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sName).zString,(pCol->sName).nByte,1);
      if (iVar8 == 0) {
        p_Var4 = pCol->pCursor->pStore->pIo->pMethods->xDelete;
        if (p_Var4 == (_func_int_unqlite_kv_cursor_ptr *)0x0) goto LAB_00118ffe;
        iVar8 = (*p_Var4)(pCol->pCursor);
        bVar12 = iVar8 == 0;
      }
      else {
LAB_00118ffe:
        bVar12 = false;
      }
      if (bVar12 == false) {
        unqliteGenErrorFormat
                  (pCol->pVm->pDb,
                   "Cannot remove collection \'%z\' due to a read-only Key/Value storage engine",
                   &pCol->sName);
        bVar12 = false;
      }
      else {
        if (0 < pCol->nLastid) {
          nId = 0;
          do {
            unqliteCollectionDropRecord(pCol,nId,0,0);
            nId = nId + 1;
          } while (nId < pCol->nLastid);
        }
        puVar5 = pCol->pVm;
        if (pCol->nRec != 0) {
          uVar11 = 0;
          pChunk_00 = pCol->pList;
          do {
            puVar6 = pChunk_00->pNext;
            jx9MemObjRelease(&pChunk_00->sValue);
            SyMemBackendPoolFree(&puVar5->sAlloc,pChunk_00);
            uVar11 = uVar11 + 1;
            pChunk_00 = puVar6;
          } while (uVar11 < pCol->nRec);
        }
        SyMemBackendFree(&puVar5->sAlloc,pCol->apRecord);
        pCol->pList = (unqlite_col_record *)0x0;
        pCol->nRec = 0;
        pCol->nRecSize = 0;
        SyBlobRelease(&pCol->sHeader);
        SyBlobRelease(&pCol->sWorker);
        SyMemBackendFree(&puVar1->sAlloc,(pCol->sName).zString);
        pBackend = puVar1->pDb;
        pChunk = pCol->pCursor;
        p_Var2 = ((pBackend->sDB).pPager)->pEngine->pIo->pMethods->xCursorRelease;
        if (p_Var2 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
          (*p_Var2)(pChunk);
        }
        SyMemBackendPoolFree(&pBackend->sMem,pChunk);
        if (pCol->pPrevCol == (unqlite_col *)0x0) {
          puVar1->apCol[puVar1->iColSize - 1 & pCol->nHash] = pCol->pNextCol;
        }
        else {
          pCol->pPrevCol->pNextCol = pCol->pNextCol;
        }
        if (pCol->pNextCol != (unqlite_col *)0x0) {
          pCol->pNextCol->pPrevCol = pCol->pPrevCol;
        }
        if (puVar1->pCol == pCol) {
          puVar1->pCol = puVar1->pCol->pNext;
        }
        puVar7 = pCol->pPrev;
        if (puVar7 != (unqlite_col *)0x0) {
          puVar7->pNext = pCol->pNext;
        }
        if (pCol->pNext != (unqlite_col *)0x0) {
          pCol->pNext->pPrev = puVar7;
        }
        puVar1->iCol = puVar1->iCol - 1;
        SyMemBackendPoolFree(&puVar1->sAlloc,pCol);
      }
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      aVar10.iVal._1_7_ = 0;
      aVar10.iVal._0_1_ = bVar12;
      pObj->x = aVar10;
      goto LAB_0011928b;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&local_40);
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
LAB_0011928b:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_drop_col(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Drop the collection */
	rc = unqliteDropCollection(pCol);
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}